

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSweep.c
# Opt level: O1

void Ssw_SmlSavePatternAig(Ssw_Man_t *p,int f)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  ulong uVar3;
  
  memset(p->pPatWords,0,(long)p->nPatWords << 2);
  pVVar2 = p->pAig->vCis;
  if (0 < pVVar2->nSize) {
    uVar3 = 0;
    do {
      iVar1 = Ssw_ManGetSatVarValue(p,(Aig_Obj_t *)pVVar2->pArray[uVar3],f);
      if (iVar1 != 0) {
        p->pPatWords[uVar3 >> 5 & 0x7ffffff] =
             p->pPatWords[uVar3 >> 5 & 0x7ffffff] | 1 << ((byte)uVar3 & 0x1f);
      }
      uVar3 = uVar3 + 1;
      pVVar2 = p->pAig->vCis;
    } while ((long)uVar3 < (long)pVVar2->nSize);
  }
  return;
}

Assistant:

void Ssw_SmlSavePatternAig( Ssw_Man_t * p, int f )
{
    Aig_Obj_t * pObj;
    int i;
    memset( p->pPatWords, 0, sizeof(unsigned) * p->nPatWords );
    Aig_ManForEachCi( p->pAig, pObj, i )
        if ( Ssw_ManGetSatVarValue( p, pObj, f ) )
            Abc_InfoSetBit( p->pPatWords, i );
}